

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondGeometric.cpp
# Opt level: O2

void __thiscall OpenMD::HBondGeometric::writeHistogram(HBondGeometric *this)

{
  char cVar1;
  ostream *poVar2;
  int i;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ofstream osq;
  
  std::ofstream::ofstream(&osq,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out)
  ;
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::operator+(&local_248,&(this->super_StaticAnalyser).outputFilename_,"q");
    snprintf(painCave.errMsg,2000,"HBondGeometric: unable to open %s\n",local_248._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_248);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::operator<<((ostream *)&osq,"# HydrogenBonding Statistics\n");
    poVar2 = std::operator<<((ostream *)&osq,"# selection1: (");
    poVar2 = std::operator<<(poVar2,(string *)&this->selectionScript1_);
    poVar2 = std::operator<<(poVar2,")");
    poVar2 = std::operator<<(poVar2,"\tselection2: (");
    poVar2 = std::operator<<(poVar2,(string *)&this->selectionScript2_);
    std::operator<<(poVar2,")\n");
    poVar2 = std::operator<<((ostream *)&osq,"# molecules in selection1: ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->nSelected_);
    std::operator<<(poVar2,"\n");
    std::operator<<((ostream *)&osq,
                    "# nHBonds\tnAcceptor\tnDonor\tp(nHBonds)\tp(nAcceptor)\tp(nDonor)\n");
    for (lVar3 = 0; lVar3 < this->nBins_; lVar3 = lVar3 + 1) {
      std::ostream::operator<<((ostream *)&osq,(int)lVar3);
      poVar2 = std::operator<<((ostream *)&osq,"\t");
      std::ostream::operator<<
                ((ostream *)poVar2,
                 (this->nHBonds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar3]);
      poVar2 = std::operator<<((ostream *)&osq,"\t");
      std::ostream::operator<<
                ((ostream *)poVar2,
                 (this->nAcceptor_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar3]);
      poVar2 = std::operator<<((ostream *)&osq,"\t");
      std::ostream::operator<<
                ((ostream *)poVar2,
                 (this->nDonor_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar3]);
      std::operator<<((ostream *)&osq,"\t");
      std::ostream::_M_insert<double>
                ((double)(this->nHBonds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar3] / (double)this->nSelected_);
      std::operator<<((ostream *)&osq,"\t");
      std::ostream::_M_insert<double>
                ((double)(this->nAcceptor_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar3] / (double)this->nSelected_);
      std::operator<<((ostream *)&osq,"\t");
      std::ostream::_M_insert<double>
                ((double)(this->nDonor_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar3] / (double)this->nSelected_);
      std::operator<<((ostream *)&osq,"\n");
    }
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&osq);
  return;
}

Assistant:

void HBondGeometric::writeHistogram() {
    std::ofstream osq(getOutputFileName().c_str());

    if (osq.is_open()) {
      osq << "# HydrogenBonding Statistics\n";
      osq << "# selection1: (" << selectionScript1_ << ")"
          << "\tselection2: (" << selectionScript2_ << ")\n";
      osq << "# molecules in selection1: " << nSelected_ << "\n";
      osq << "# "
             "nHBonds\tnAcceptor\tnDonor\tp(nHBonds)\tp(nAcceptor)\tp(nDonor)"
             "\n";
      // Normalize by number of frames and write it out:
      for (int i = 0; i < nBins_; ++i) {
        osq << i;
        osq << "\t" << nHBonds_[i];
        osq << "\t" << nAcceptor_[i];
        osq << "\t" << nDonor_[i];
        osq << "\t" << (RealType)(nHBonds_[i]) / nSelected_;
        osq << "\t" << (RealType)(nAcceptor_[i]) / nSelected_;
        osq << "\t" << (RealType)(nDonor_[i]) / nSelected_;
        osq << "\n";
      }
      osq.close();

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "HBondGeometric: unable to open %s\n",
               (getOutputFileName() + "q").c_str());
      painCave.isFatal = 1;
      simError();
    }
  }